

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

void init_buffer_callbacks(aom_codec_alg_priv_t *ctx)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long in_RDI;
  BufferPool *pool;
  AV1_COMMON *cm;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  InternalFrameBufferList *in_stack_ffffffffffffffc8;
  
  lVar1 = **(long **)(*(long *)(in_RDI + 0x69f0) + 0x20);
  lVar2 = *(long *)(lVar1 + 0x9e50);
  *(undefined8 *)(lVar1 + 0x3c48) = 0;
  *(undefined4 *)(lVar1 + 0x3d60) = *(undefined4 *)(in_RDI + 0x1b8);
  *(undefined4 *)(lVar1 + 0x5f724) = *(undefined4 *)(in_RDI + 0x1bc);
  *(undefined4 *)(lVar1 + 0x5f728) = *(undefined4 *)(in_RDI + 0x1c0);
  if ((*(long *)(in_RDI + 0x6b20) == 0) || (*(long *)(in_RDI + 0x6b28) == 0)) {
    *(code **)(lVar2 + 0x30) = av1_get_frame_buffer;
    *(code **)(lVar2 + 0x38) = av1_release_frame_buffer;
    iVar3 = av1_alloc_internal_frame_buffers(in_stack_ffffffffffffffc8);
    if (iVar3 != 0) {
      aom_internal_error((aom_internal_error_info *)(lVar1 + 0x5ff08),AOM_CODEC_MEM_ERROR,
                         "Failed to initialize internal frame buffers");
    }
    *(long *)(lVar2 + 0x28) = lVar2 + 0x50;
  }
  else {
    *(undefined8 *)(lVar2 + 0x30) = *(undefined8 *)(in_RDI + 0x6b20);
    *(undefined8 *)(lVar2 + 0x38) = *(undefined8 *)(in_RDI + 0x6b28);
    *(undefined8 *)(lVar2 + 0x28) = *(undefined8 *)(in_RDI + 0x6b18);
  }
  return;
}

Assistant:

static void init_buffer_callbacks(aom_codec_alg_priv_t *ctx) {
  AVxWorker *const worker = ctx->frame_worker;
  FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
  AV1Decoder *const pbi = frame_worker_data->pbi;
  AV1_COMMON *const cm = &pbi->common;
  BufferPool *const pool = cm->buffer_pool;

  cm->cur_frame = NULL;
  cm->features.byte_alignment = ctx->byte_alignment;
  pbi->skip_loop_filter = ctx->skip_loop_filter;
  pbi->skip_film_grain = ctx->skip_film_grain;

  if (ctx->get_ext_fb_cb != NULL && ctx->release_ext_fb_cb != NULL) {
    pool->get_fb_cb = ctx->get_ext_fb_cb;
    pool->release_fb_cb = ctx->release_ext_fb_cb;
    pool->cb_priv = ctx->ext_priv;
  } else {
    pool->get_fb_cb = av1_get_frame_buffer;
    pool->release_fb_cb = av1_release_frame_buffer;

    if (av1_alloc_internal_frame_buffers(&pool->int_frame_buffers))
      aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                         "Failed to initialize internal frame buffers");

    pool->cb_priv = &pool->int_frame_buffers;
  }
}